

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes SkipNumbers(CSzData *sd2,UInt32 num)

{
  byte bVar1;
  byte *pbVar2;
  Byte *pBVar3;
  uint local_38;
  byte local_32;
  uint i;
  Byte mask;
  Byte firstByte;
  CSzData sd;
  UInt32 num_local;
  CSzData *sd2_local;
  
  _i = sd2->Data;
  sd.Data = (Byte *)sd2->Size;
  sd.Size._4_4_ = num;
  while( true ) {
    if (sd.Size._4_4_ == 0) {
      sd2->Data = _i;
      sd2->Size = (size_t)sd.Data;
      return 0;
    }
    if (sd.Data == (Byte *)0x0) break;
    pBVar3 = sd.Data + -1;
    bVar1 = *_i;
    pbVar2 = _i + 1;
    if ((bVar1 & 0x80) != 0) {
      if ((bVar1 & 0x40) == 0) {
        if (pBVar3 == (Byte *)0x0) {
          return 0x10;
        }
        pbVar2 = _i + 2;
        pBVar3 = sd.Data + -2;
      }
      else {
        local_32 = 0x20;
        for (local_38 = 2; local_38 < 8 && (bVar1 & local_32) != 0; local_38 = local_38 + 1) {
          local_32 = (byte)((int)(uint)local_32 >> 1);
        }
        if (pBVar3 < (Byte *)(ulong)local_38) {
          return 0x10;
        }
        pbVar2 = _i + 1 + local_38;
        pBVar3 = pBVar3 + -(ulong)local_38;
      }
    }
    sd.Data = pBVar3;
    _i = pbVar2;
    sd.Size._4_4_ = sd.Size._4_4_ - 1;
  }
  return 0x10;
}

Assistant:

static MY_NO_INLINE SRes SkipNumbers(CSzData *sd2, UInt32 num)
{
  CSzData sd;
  sd = *sd2;
  for (; num != 0; num--)
  {
    Byte firstByte, mask;
    unsigned i;
    SZ_READ_BYTE_2(firstByte);
    if ((firstByte & 0x80) == 0)
      continue;
    if ((firstByte & 0x40) == 0)
    {
      if (sd.Size == 0)
        return SZ_ERROR_ARCHIVE;
      sd.Size--;
      sd.Data++;
      continue;
    }
    mask = 0x20;
    for (i = 2; i < 8 && (firstByte & mask) != 0; i++)
      mask >>= 1;
    if (i > sd.Size)
      return SZ_ERROR_ARCHIVE;
    SKIP_DATA2(sd, i);
  }
  *sd2 = sd;
  return SZ_OK;
}